

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,size_t primID,BBox1f time_range)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar13 [64];
  float fVar14;
  vfloat4 b1;
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar28;
  vfloat4 a0;
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  float fVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  float fVar39;
  
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = time_range;
  BVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = BVar1.lower;
  auVar15._4_4_ = BVar1.upper;
  fVar21 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar14 = BVar1.lower;
  auVar15 = vmovshdup_avx(auVar15);
  fVar28 = auVar15._0_4_ - fVar14;
  auVar10 = vmovshdup_avx(auVar13._0_16_);
  auVar15 = ZEXT416((uint)(fVar21 * ((time_range.lower - fVar14) / fVar28) * 1.0000002));
  auVar15 = vroundss_avx(auVar15,auVar15,9);
  auVar15 = vmaxss_avx(ZEXT816(0),auVar15);
  auVar10 = ZEXT416((uint)(fVar21 * ((auVar10._0_4_ - fVar14) / fVar28) * 0.99999976));
  auVar10 = vroundss_avx(auVar10,auVar10,10);
  auVar10 = vminss_avx(auVar10,ZEXT416((uint)fVar21));
  if ((int)auVar10._0_4_ == (int)auVar15._0_4_) {
    auVar15 = vdpps_avx(_DAT_01fb04e0,_DAT_01fb04e0,0x7f);
    auVar11 = SUB6416(ZEXT464(0xbf800000),0);
    auVar10 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar15 = vcmpps_avx(auVar10,auVar15,1);
    auVar15 = vshufps_avx(auVar15,auVar15,0);
    auVar15 = vblendvps_avx(auVar11,_DAT_01fb04e0,auVar15);
    auVar10 = vdpps_avx(auVar15,auVar15,0x7f);
    auVar11 = vrsqrtss_avx(auVar10,auVar10);
    fVar21 = auVar11._0_4_;
    auVar10 = ZEXT416((uint)(fVar21 * 1.5 - auVar10._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    aVar16._0_4_ = auVar15._0_4_ * auVar10._0_4_;
    aVar16._4_4_ = auVar15._4_4_ * auVar10._4_4_;
    aVar16._8_4_ = auVar15._8_4_ * auVar10._8_4_;
    aVar16._12_4_ = auVar15._12_4_ * auVar10._12_4_;
    auVar22._0_4_ = aVar16._0_4_ * 1.0;
    auVar22._4_4_ = aVar16._4_4_ * 0.0;
    auVar22._8_4_ = aVar16._8_4_ * 0.0;
    auVar22._12_4_ = aVar16._12_4_ * 0.0;
    auVar15 = vshufps_avx((undefined1  [16])aVar16,(undefined1  [16])aVar16,0xc9);
    auVar11._0_4_ = auVar15._0_4_ * 1.0;
    auVar11._4_4_ = auVar15._4_4_ * 0.0;
    auVar11._8_4_ = auVar15._8_4_ * 0.0;
    auVar11._12_4_ = auVar15._12_4_ * 0.0;
    auVar15 = vshufps_avx(auVar22,auVar22,0xd2);
    auVar11 = vsubps_avx(auVar15,auVar11);
    auVar15 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar10 = vrsqrtss_avx(auVar15,auVar15);
    fVar21 = auVar10._0_4_;
    auVar15 = ZEXT416((uint)(fVar21 * 1.5 - auVar15._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
    auVar15 = vshufps_avx(auVar15,auVar15,0);
    aVar23._0_4_ = auVar15._0_4_ * auVar11._0_4_;
    aVar23._4_4_ = auVar15._4_4_ * auVar11._4_4_;
    aVar23._8_4_ = auVar15._8_4_ * auVar11._8_4_;
    aVar23._12_4_ = auVar15._12_4_ * auVar11._12_4_;
    auVar10 = _DAT_01f7b700;
  }
  else {
    iVar6 = ((int)auVar15._0_4_ + (int)auVar10._0_4_) / 2;
    pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             vertices.items;
    uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar4 = pBVar3[iVar6].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[iVar6].super_RawBufferView.stride;
    lVar7 = (uVar2 + 1) * sVar5;
    lVar8 = (uVar2 + 2) * sVar5;
    lVar9 = (uVar2 + 3) * sVar5;
    fVar21 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar11 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5),
                            ZEXT416((uint)(fVar21 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc))),0x30)
    ;
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                            ZEXT416((uint)(fVar21 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar8),
                            ZEXT416((uint)(fVar21 * *(float *)(pcVar4 + lVar8 + 0xc))),0x30);
    auVar22 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar9),
                            ZEXT416((uint)(fVar21 * *(float *)(pcVar4 + lVar9 + 0xc))),0x30);
    fVar30 = auVar10._0_4_;
    fVar35 = auVar10._4_4_;
    fVar36 = auVar10._8_4_;
    fVar37 = auVar10._12_4_;
    fVar21 = auVar15._0_4_;
    fVar28 = auVar15._4_4_;
    fVar14 = auVar15._8_4_;
    fVar29 = auVar15._12_4_;
    auVar38._0_4_ = auVar11._0_4_ * 0.16666667 + fVar21 * 0.6666667 + fVar30 * 0.16666667;
    auVar38._4_4_ = auVar11._4_4_ * 0.16666667 + fVar28 * 0.6666667 + fVar35 * 0.16666667;
    auVar38._8_4_ = auVar11._8_4_ * 0.16666667 + fVar14 * 0.6666667 + fVar36 * 0.16666667;
    auVar38._12_4_ = auVar11._12_4_ * 0.16666667 + fVar29 * 0.6666667 + fVar37 * 0.16666667;
    auVar12._0_4_ = fVar21 * 0.16666667 + fVar30 * 0.6666667 + auVar22._0_4_ * 0.16666667;
    auVar12._4_4_ = fVar28 * 0.16666667 + fVar35 * 0.6666667 + auVar22._4_4_ * 0.16666667;
    auVar12._8_4_ = fVar14 * 0.16666667 + fVar36 * 0.6666667 + auVar22._8_4_ * 0.16666667;
    auVar12._12_4_ = fVar29 * 0.16666667 + fVar37 * 0.6666667 + auVar22._12_4_ * 0.16666667;
    auVar38 = vsubps_avx(auVar12,auVar38);
    auVar15 = vdpps_avx(auVar38,auVar38,0x7f);
    auVar10 = vrsqrtss_avx(auVar15,auVar15);
    fVar39 = auVar10._0_4_;
    auVar10 = ZEXT416((uint)(fVar39 * 1.5 - auVar15._0_4_ * 0.5 * fVar39 * fVar39 * fVar39));
    auVar12 = vshufps_avx(auVar10,auVar10,0);
    auVar10._0_4_ = auVar38._0_4_ * auVar12._0_4_;
    auVar10._4_4_ = auVar38._4_4_ * auVar12._4_4_;
    auVar10._8_4_ = auVar38._8_4_ * auVar12._8_4_;
    auVar10._12_4_ = auVar38._12_4_ * auVar12._12_4_;
    if (1e-18 < auVar15._0_4_) {
      auVar31._0_4_ = fVar30 * 0.5 + auVar22._0_4_ * 0.0;
      auVar31._4_4_ = fVar35 * 0.5 + auVar22._4_4_ * 0.0;
      auVar31._8_4_ = fVar36 * 0.5 + auVar22._8_4_ * 0.0;
      auVar31._12_4_ = fVar37 * 0.5 + auVar22._12_4_ * 0.0;
      auVar24._0_4_ = fVar21 * 0.0;
      auVar24._4_4_ = fVar28 * 0.0;
      auVar24._8_4_ = fVar14 * 0.0;
      auVar24._12_4_ = fVar29 * 0.0;
      auVar15 = vsubps_avx(auVar31,auVar24);
      auVar17._0_4_ = auVar11._0_4_ * 0.5;
      auVar17._4_4_ = auVar11._4_4_ * 0.5;
      auVar17._8_4_ = auVar11._8_4_ * 0.5;
      auVar17._12_4_ = auVar11._12_4_ * 0.5;
      auVar22 = vsubps_avx(auVar15,auVar17);
      auVar15 = vshufps_avx(auVar22,auVar22,0xc9);
      auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
      auVar18._0_4_ = auVar22._0_4_ * auVar11._0_4_;
      auVar18._4_4_ = auVar22._4_4_ * auVar11._4_4_;
      auVar18._8_4_ = auVar22._8_4_ * auVar11._8_4_;
      auVar18._12_4_ = auVar22._12_4_ * auVar11._12_4_;
      auVar25._0_4_ = auVar15._0_4_ * auVar10._0_4_;
      auVar25._4_4_ = auVar15._4_4_ * auVar10._4_4_;
      auVar25._8_4_ = auVar15._8_4_ * auVar10._8_4_;
      auVar25._12_4_ = auVar15._12_4_ * auVar10._12_4_;
      auVar15 = vsubps_avx(auVar25,auVar18);
      auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
    }
    else {
      auVar15 = ZEXT816(0x3f80000000000000);
      auVar10 = _DAT_01f7b700;
    }
    auVar11 = vdpps_avx(auVar15,auVar15,0x7f);
    if (auVar11._0_4_ <= 1e-18) {
      auVar11 = vshufpd_avx(auVar10,auVar10,1);
      auVar15 = vmovshdup_avx(auVar10);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar26._0_4_ = auVar15._0_4_ ^ 0x80000000;
      auVar15 = vunpckhps_avx(auVar10,ZEXT816(0) << 0x40);
      auVar26._4_12_ = ZEXT812(0) << 0x20;
      auVar12 = vshufps_avx(auVar15,auVar26,0x41);
      auVar20._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
      auVar20._8_8_ = auVar11._8_8_ ^ auVar33._8_8_;
      auVar22 = vinsertps_avx(auVar20,auVar10,0x2a);
      auVar15 = vdpps_avx(auVar12,auVar12,0x7f);
      auVar11 = vdpps_avx(auVar22,auVar22,0x7f);
      auVar15 = vcmpps_avx(auVar11,auVar15,1);
      auVar15 = vshufps_avx(auVar15,auVar15,0);
      auVar15 = vblendvps_avx(auVar22,auVar12,auVar15);
      auVar11 = vdpps_avx(auVar15,auVar15,0x7f);
      auVar22 = vrsqrtss_avx(auVar11,auVar11);
      fVar21 = auVar22._0_4_;
      auVar11 = ZEXT416((uint)(fVar21 * 1.5 - auVar11._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
      auVar11 = vshufps_avx(auVar11,auVar11,0);
      aVar16._0_4_ = auVar15._0_4_ * auVar11._0_4_;
      aVar16._4_4_ = auVar15._4_4_ * auVar11._4_4_;
      aVar16._8_4_ = auVar15._8_4_ * auVar11._8_4_;
      aVar16._12_4_ = auVar15._12_4_ * auVar11._12_4_;
      auVar15 = vshufps_avx((undefined1  [16])aVar16,(undefined1  [16])aVar16,0xc9);
      auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
      auVar34._0_4_ = auVar11._0_4_ * aVar16._0_4_;
      auVar34._4_4_ = auVar11._4_4_ * aVar16._4_4_;
      auVar34._8_4_ = auVar11._8_4_ * aVar16._8_4_;
      auVar34._12_4_ = auVar11._12_4_ * aVar16._12_4_;
      auVar27._0_4_ = auVar10._0_4_ * auVar15._0_4_;
      auVar27._4_4_ = auVar10._4_4_ * auVar15._4_4_;
      auVar27._8_4_ = auVar10._8_4_ * auVar15._8_4_;
      auVar27._12_4_ = auVar10._12_4_ * auVar15._12_4_;
      auVar15 = vsubps_avx(auVar27,auVar34);
      auVar22 = vshufps_avx(auVar15,auVar15,0xc9);
      auVar15 = vdpps_avx(auVar22,auVar22,0x7f);
      auVar11 = vrsqrtss_avx(auVar15,auVar15);
      fVar21 = auVar11._0_4_;
      auVar15 = ZEXT416((uint)(fVar21 * 1.5 - auVar15._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
      auVar15 = vshufps_avx(auVar15,auVar15,0);
      aVar23._0_4_ = auVar15._0_4_ * auVar22._0_4_;
      aVar23._4_4_ = auVar15._4_4_ * auVar22._4_4_;
      aVar23._8_4_ = auVar15._8_4_ * auVar22._8_4_;
      aVar23._12_4_ = auVar15._12_4_ * auVar22._12_4_;
    }
    else {
      auVar22 = vrsqrtss_avx(auVar11,auVar11);
      fVar21 = auVar22._0_4_;
      auVar11 = ZEXT416((uint)(fVar21 * 1.5 - auVar11._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
      auVar11 = vshufps_avx(auVar11,auVar11,0);
      aVar23._0_4_ = auVar15._0_4_ * auVar11._0_4_;
      aVar23._4_4_ = auVar15._4_4_ * auVar11._4_4_;
      aVar23._8_4_ = auVar15._8_4_ * auVar11._8_4_;
      aVar23._12_4_ = auVar15._12_4_ * auVar11._12_4_;
      auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
      auVar11 = vshufps_avx((undefined1  [16])aVar23,(undefined1  [16])aVar23,0xc9);
      auVar32._0_4_ = auVar10._0_4_ * auVar11._0_4_;
      auVar32._4_4_ = auVar10._4_4_ * auVar11._4_4_;
      auVar32._8_4_ = auVar10._8_4_ * auVar11._8_4_;
      auVar32._12_4_ = auVar10._12_4_ * auVar11._12_4_;
      auVar19._0_4_ = auVar15._0_4_ * aVar23._0_4_;
      auVar19._4_4_ = auVar15._4_4_ * aVar23._4_4_;
      auVar19._8_4_ = auVar15._8_4_ * aVar23._8_4_;
      auVar19._12_4_ = auVar15._12_4_ * aVar23._12_4_;
      auVar15 = vsubps_avx(auVar19,auVar32);
      auVar22 = vshufps_avx(auVar15,auVar15,0xc9);
      auVar15 = vdpps_avx(auVar22,auVar22,0x7f);
      auVar11 = vrsqrtss_avx(auVar15,auVar15);
      fVar21 = auVar11._0_4_;
      auVar15 = ZEXT416((uint)(fVar21 * 1.5 - auVar15._0_4_ * 0.5 * fVar21 * fVar21 * fVar21));
      auVar15 = vshufps_avx(auVar15,auVar15,0);
      aVar16._0_4_ = auVar15._0_4_ * auVar22._0_4_;
      aVar16._4_4_ = auVar15._4_4_ * auVar22._4_4_;
      aVar16._8_4_ = auVar15._8_4_ * auVar22._8_4_;
      aVar16._12_4_ = auVar15._12_4_ * auVar22._12_4_;
    }
  }
  (__return_storage_ptr__->vx).field_0 = aVar16;
  (__return_storage_ptr__->vy).field_0 = aVar23;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }